

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robot.cpp
# Opt level: O0

Joint * __thiscall
Robot::IK(Joint *__return_storage_ptr__,Robot *this,Pose *p,Joint jAct,bool bFrontBack,bool bUpDown)

{
  Scalar SVar1;
  Brand BVar2;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar3;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  Scalar *pSVar4;
  ostream *poVar5;
  Scalar *pSVar6;
  int __x;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *pDVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double extraout_XMM0_Qa_01;
  double dVar12;
  double dVar13;
  double dVar14;
  Matrix3d local_5f8;
  non_const_type local_5b0;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_5a8;
  Matrix<double,3,3,0,3,3> local_598 [8];
  Matrix3d Rwrist;
  Matrix3d local_508;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_4c0;
  Matrix<double,3,3,0,3,3> local_4b0 [8];
  Matrix3d Rarm;
  Pose pJ23;
  Pose pJ1;
  double sin_gamma;
  double cos_gamma;
  Vector3d local_3a8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_390;
  Scalar local_358 [3];
  Scalar local_340;
  Scalar local_338;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_330 [24];
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_318;
  Matrix3d local_2f8;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_2b0;
  Matrix3d local_2a0;
  non_const_type local_258;
  Matrix3d local_250;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  local_208;
  Matrix3d local_1f8;
  Vector3d local_1b0;
  undefined1 local_198 [8];
  Pose Rtmp;
  Pose MP;
  undefined1 local_110 [8];
  Vector3d WP;
  Vector3d x_hat;
  double sin_beta;
  double cos_beta;
  double delta;
  double gamma;
  double beta;
  double alpha;
  double b4x;
  double rho;
  double h;
  double l;
  double WPxy;
  double Rwrist33;
  double Rwrist32;
  double Rwrist13;
  double Rwrist12;
  double Rwrist31;
  double Rwrist21;
  double Rwrist11;
  double J6;
  double J5;
  double J4;
  double J3;
  double J2;
  double J1;
  bool bUpDown_local;
  bool bFrontBack_local;
  Pose *p_local;
  Robot *this_local;
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_110);
  Pose::Pose((Pose *)(Rtmp.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array + 3));
  Pose::Pose((Pose *)local_198);
  BVar2 = this->brand;
  if (BVar2 == IR) {
    std::operator<<((ostream *)&std::cout,"IK IR\n");
    Pose::operator=((Pose *)(Rtmp.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array + 3),p);
  }
  else if (BVar2 == ABB) {
    std::operator<<((ostream *)&std::cout,"IK ABB\n");
    Pose::getpos(&local_1b0,p);
    Pose::setpos((Pose *)(Rtmp.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                          m_storage.m_data.array + 3),&local_1b0);
    Pose::setrot((Pose *)local_198,0.0,1.5707963267948966,0.0);
    Pose::getR(&local_250,p);
    Pose::getR(&local_2a0,(Pose *)local_198);
    local_258 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_2a0);
    local_208 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_250,
                           (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                           &local_258);
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
              ((Matrix<double,3,3,0,3,3> *)&local_1f8,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
                *)&local_208);
    Pose::setrot((Pose *)(Rtmp.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                          m_storage.m_data.array + 3),&local_1f8);
  }
  else if (BVar2 == KUKA) {
    std::operator<<((ostream *)&std::cout,"IK KUKA\n");
    Pose::operator=((Pose *)(Rtmp.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array + 3),p);
  }
  Pose::getR(&local_2f8,
             (Pose *)(Rtmp.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array + 3));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_330);
  local_338 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_318,local_330,&local_338);
  local_340 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_318,&local_340);
  local_358[0] = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (pCVar3,local_358);
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished(pCVar3);
  local_2b0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_2f8,other);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),(DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                   *)&local_2b0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_318);
  Pose::getpos(&local_3a8,
               (Pose *)(Rtmp.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                        m_storage.m_data.array + 3));
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&cos_gamma,&this->a6x,
                   (StorageBaseType *)
                   (WP.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array + 2));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_390,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_3a8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&cos_gamma);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)local_110,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_390);
  pDVar7 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_110;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar7,0);
  std::abs((int)pDVar7);
  if (extraout_XMM0_Qa < 0.001) {
    pDVar7 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_110;
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar7,1);
    std::abs((int)pDVar7);
    if (extraout_XMM0_Qa_00 < 0.001) {
      J2 = Joint::getj1(&jAct);
      goto LAB_001669a5;
    }
  }
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_110,1);
  dVar8 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_110,0);
  J2 = atan2(dVar8,*pSVar4);
  if (bFrontBack) {
    if (J2 <= 0.0) {
      J2 = J2 + 3.141592653589793;
    }
    else {
      J2 = J2 - 3.141592653589793;
    }
  }
LAB_001669a5:
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_110,0);
  dVar8 = pow(*pSVar4,2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_110,1);
  dVar9 = pow(*pSVar4,2.0);
  dVar8 = sqrt(dVar8 + dVar9);
  if (bFrontBack) {
    h = dVar8 + this->a2x;
  }
  else {
    h = dVar8 - this->a2x;
  }
  pDVar7 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_110;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar7,2);
  __x = (int)pDVar7;
  dVar8 = (*pSVar4 - this->a1z) - this->a2z;
  dVar9 = pow(dVar8,2.0);
  dVar10 = pow(h,2.0);
  dVar9 = sqrt(dVar9 + dVar10);
  dVar10 = pow(this->a4z,2.0);
  dVar11 = pow(this->a4x + this->a5x,2.0);
  dVar10 = sqrt(dVar10 + dVar11);
  if (dVar9 < this->a3z + dVar10) {
    std::abs(__x);
    if (extraout_XMM0_Qa_01 < dVar9) {
      dVar8 = atan2(dVar8,h);
      dVar11 = pow(dVar9,2.0);
      dVar12 = pow(this->a3z,2.0);
      dVar13 = pow(dVar10,2.0);
      dVar11 = ((dVar11 + dVar12) - dVar13) / (dVar9 * 2.0 * this->a3z);
      dVar12 = pow(dVar11,2.0);
      dVar12 = sqrt(1.0 - dVar12);
      dVar11 = atan2(dVar12,dVar11);
      if (bUpDown) {
        J3 = (1.5707963267948966 - dVar8) + dVar11;
      }
      else {
        J3 = (1.5707963267948966 - dVar8) - dVar11;
      }
      dVar8 = pow(this->a3z,2.0);
      dVar11 = pow(dVar10,2.0);
      dVar9 = pow(dVar9,2.0);
      dVar8 = ((dVar8 + dVar11) - dVar9) / (this->a3z * 2.0 * dVar10);
      dVar9 = pow(dVar8,2.0);
      dVar9 = sqrt(1.0 - dVar9);
      dVar8 = atan2(dVar9,dVar8);
      dVar14 = atan2(this->a4x + this->a5x,this->a4z);
      dVar14 = (3.141592653589793 - dVar8) - dVar14;
      Pose::Pose((Pose *)(pJ23.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                          m_storage.m_data.array + 3));
      Pose::Pose((Pose *)(Rarm.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + 8));
      Pose::setrot((Pose *)(pJ23.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 3),0.0,0.0,J2);
      Pose::setrot((Pose *)(Rarm.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),0.0,J3 + dVar14,0.0);
      Pose::getR(&local_508,
                 (Pose *)(pJ23.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                          m_storage.m_data.array + 3));
      Pose::getR((Matrix3d *)
                 (Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 8),
                 (Pose *)(Rarm.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + 8));
      local_4c0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                            ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_508,
                             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                             (Rwrist.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array + 8));
      Eigen::Matrix<double,3,3,0,3,3>::
      Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                (local_4b0,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)&local_4c0);
      local_5b0 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_4b0);
      Pose::getR(&local_5f8,
                 (Pose *)(Rtmp.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                          m_storage.m_data.array + 3));
      local_5a8 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                            ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>> *)
                             &local_5b0,
                             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_5f8);
      Eigen::Matrix<double,3,3,0,3,3>::
      Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                (local_598,
                 (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)&local_5a8);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_598,0,0)
      ;
      dVar8 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_598,1,0)
      ;
      dVar9 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_598,2,0)
      ;
      SVar1 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_598,0,1)
      ;
      dVar10 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_598,0,2)
      ;
      dVar11 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_598,2,1)
      ;
      dVar12 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_598,2,2)
      ;
      dVar13 = *pSVar6;
      if (0.9999999 <= dVar8) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Rwrist11 = +1");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        J6 = 0.0;
        J5 = Joint::getj4(&jAct);
        dVar8 = atan2(dVar12,dVar13);
        Rwrist11 = dVar8 - J5;
      }
      else if (dVar8 <= -0.9999999) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Rwrist11 = -1");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        J6 = 3.141592653589793;
        J5 = Joint::getj4(&jAct);
        dVar8 = atan2(dVar12,dVar13);
        Rwrist11 = dVar8 + J5;
      }
      else {
        dVar12 = pow(dVar8,2.0);
        dVar12 = sqrt(1.0 - dVar12);
        J6 = atan2(dVar12,dVar8);
        J5 = atan2(dVar9,-SVar1);
        Rwrist11 = atan2(dVar10,dVar11);
      }
      Joint::Joint(__return_storage_ptr__,J2,J3,dVar14,J5,J6,Rwrist11);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Error: J2 too small");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      memcpy(__return_storage_ptr__,&jAct,0x30);
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Error: impossible to reach that point");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    memcpy(__return_storage_ptr__,&jAct,0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

Joint Robot::IK(Pose p, Joint jAct, bool bFrontBack, bool bUpDown){
    double J1, J2, J3, J4, J5, J6;
    double Rwrist11, Rwrist21, Rwrist31, Rwrist12, Rwrist13, Rwrist32, Rwrist33;
    double WPxy, l, h;
    double rho, b4x;
    double alpha, beta, gamma, delta;
    double cos_beta, sin_beta;
    Vector3d x_hat, WP;
    //Pose of the mounting point (center of the axe 6)
    Pose MP;
    Pose Rtmp;

    switch(this->brand)
    {
        case IR:
            std::cout << "IK IR\n";
            MP = p;
            break;
        case ABB:
            std::cout << "IK ABB\n";
            // Mounting point MP (Center of the flange of axis 6)      
            MP.setpos(p.getpos());
            // Rotation 90° around Y
            Rtmp.setrot(0.0, M_PI/2.0, 0.0);
            MP.setrot(p.getR() * Rtmp.getR().transpose());
            break;
        case KUKA:
            std::cout << "IK KUKA\n";
            MP = p;
            break;
    }

    x_hat = MP.getR() * ((Vector3d() << 1, 0, 0).finished());
    WP = MP.getpos() - (this->a6x * x_hat);

    // Find J1
    // Check if there is a shoulder singularity
    if((abs(WP(0)) < 0.001) && (abs(WP(1)) < 0.001)){
        // In this case we have a shoulder singularity.
        // Fix J1 as the actual value of J1
        J1 = jAct.getj1();
    }
    else{
        // FRONT solution
        J1 = atan2(WP(1), WP(0));
        // To have the BACK solution I need to add or substract pi
        if(bFrontBack){
            // BACK solution is selected
            if(J1 > 0)
                J1 -= M_PI;
            else
                J1 += M_PI;
        }
    }

    // Find J2 and J3
    WPxy = sqrt( pow(WP(0),2) + pow(WP(1),2) );
    //std::cout << "WPxy:\n" << WPxy << std::endl;

    if(bFrontBack){
        // BACK solution
        l = WPxy + this->a2x;
    }
    else{
        // FRONT solution
        l = WPxy - this->a2x;
    }
    //std::cout << "l:\n" << l << std::endl;
    h = WP(2) - this->a1z - this->a2z;
    //std::cout << "h:\n" << h << std::endl;

    rho = sqrt( pow(h,2) + pow(l,2) );
    //std::cout << "rho:\n" << rho << std::endl;
    b4x = sqrt( pow(this->a4z,2) + pow(this->a4x+this->a5x,2) );
    //std::cout << "b4x:\n" << b4x << std::endl;
    if(rho >= (this->a3z+b4x)){
        // It is not possible to reach that point
        std::cout << "Error: impossible to reach that point" << std::endl;
        return jAct;
    }
    if(rho <= abs(a3z-b4x)){
        // J2 too close to the robot himself
        std::cout << "Error: J2 too small" << std::endl;
        return jAct;
    }

    alpha = atan2(h, l);
    cos_beta = (pow(rho,2) + pow(a3z,2) - pow(b4x,2)) / (2*rho*a3z);
    sin_beta = sqrt(1 - pow(cos_beta,2));
    beta = atan2(sin_beta, cos_beta);

    if(bUpDown){
        // DOWN solution
        J2 = M_PI_2 - alpha + beta;
    }     
    else{
        // UP solution
        J2 = M_PI_2 - alpha - beta;
    }

    double cos_gamma, sin_gamma;
    cos_gamma = (pow(a3z,2) + pow(b4x,2) - pow(rho,2)) / (2*a3z*b4x);
    sin_gamma = sqrt(1 - pow(cos_gamma,2));
    gamma = atan2(sin_gamma, cos_gamma);

    delta = atan2(this->a4x+this->a5x, this->a4z);

    J3 = M_PI - gamma - delta;

    //std::cout << "J1:\n" << J1 << std::endl;
    //std::cout << "J2:\n" << J2 << std::endl;
    //std::cout << "J3:\n" << J3 << std::endl;

    Pose pJ1, pJ23;
    pJ1.setrot(0.0, 0.0, J1);
    pJ23.setrot(0.0, (J2+J3), 0.0);
    //Matrix3d Rarm = RaroundZ(J1) * RaroundY(J2+J3);
    Matrix3d Rarm = pJ1.getR() * pJ23.getR();
    Matrix3d Rwrist = Rarm.transpose() * MP.getR();

    //Find J4, J5, J6

    Rwrist11 = Rwrist(0,0);
    Rwrist21 = Rwrist(1,0);
    Rwrist31 = Rwrist(2,0);
    Rwrist12 = Rwrist(0,1);
    Rwrist13 = Rwrist(0,2);
    Rwrist32 = Rwrist(2,1);
    Rwrist33 = Rwrist(2,2);

    if (Rwrist11 < 0.9999999) {
        if (Rwrist11 > -0.9999999) {
            //J5 = acos(Rwrist11);
            J5 = atan2( sqrt(1-pow(Rwrist11,2)) , Rwrist11 );
            J4 = atan2(Rwrist21,-Rwrist31);
            J6 = atan2(Rwrist12,Rwrist13);
        }
        else // Rwrist11 = −1 
        {
            std::cout << "Rwrist11 = -1" << std::endl;
            // Wrist singularity. J5 = 180 -> This condition is not
            // possible because the spherical wrist cannot rotate J5 = 180.
            // Not a unique solution: J6 − J4 = atan2(Rwrist32,Rwrist33)
            J5 = M_PI;
            J4 = jAct.getj4();
            J6 = atan2(Rwrist32,Rwrist33) + J4;
        }
    }
    else // Rwrist11 = +1
    {
        std::cout << "Rwrist11 = +1" << std::endl;
        // Wrist singularity. J5 = 0
        // Not a unique solution: J4 + J6 = atan2(Rwrist32,Rwrist33)
        J5 = 0;
        J4 = jAct.getj4();
        J6 = atan2(Rwrist32,Rwrist33) - J4;
    }

    Joint j(J1, J2, J3, J4, J5, J6);
    return j;
}